

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest1_2 *this,_variable_type *variable_type,
          uint array_size)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ostream *poVar5;
  size_t sVar6;
  undefined4 in_register_0000000c;
  _variable_type *variable_type_00;
  _variable_type *variable_type_01;
  _variable_type *variable_type_02;
  bool *pbVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  uint array_index_1;
  uint array_index;
  ulong uVar11;
  long lVar12;
  string variable_type_glsl_as_int;
  _variable_type result_as_int_variable_type;
  string variable_type_glsl;
  uint n_variable_type_components;
  _variable_type result_as_int_variable_type_1;
  stringstream variable_type_glsl_array_sstream;
  stringstream variable_type_glsl_arrayed_sstream;
  stringstream result_sstream;
  string local_560;
  _variable_type local_53c;
  ulong local_538;
  _variable_type local_530;
  undefined4 uStack_52c;
  long local_528;
  long local_520 [2];
  string local_510;
  uint local_4ec;
  ulong local_4e8;
  uint local_4dc;
  string *local_4d8;
  _variable_type local_4cc;
  stringstream local_4c8 [16];
  undefined1 local_4b8 [376];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_538 = CONCAT44(in_register_0000000c,array_size);
  local_4d8 = __return_storage_ptr__;
  local_53c = Utils::getBaseVariableType(variable_type);
  local_4ec = Utils::getNumberOfComponentsForVariableType(variable_type);
  local_4dc = local_4ec;
  std::__cxx11::stringstream::stringstream(local_1b8);
  Utils::getVariableTypeGLSLString_abi_cxx11_(&local_510,(Utils *)variable_type,variable_type_00);
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,local_510._M_dataplus._M_p,local_510._M_string_length);
  local_4e8 = local_538 & 0xffffffff;
  if (1 < (uint)local_538) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               (char *)CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_),
               local_560._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_) !=
        &local_560.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_),
                      local_560.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n",
             0x3c);
  if (*variable_type == VARIABLE_TYPE_DOUBLE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#extension GL_ARB_gpu_shader_fp64 : require\n",0x2c);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nsubroutine ",0xc);
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,
                      (char *)CONCAT44(local_560._M_dataplus._M_p._4_4_,
                                       local_560._M_dataplus._M_p._0_4_),local_560._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," colorGetter(in ",0x10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_510._M_dataplus._M_p,local_510._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in_value",9);
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)CONCAT44(uStack_52c,local_530),local_528);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n\n",4);
  if ((long *)CONCAT44(uStack_52c,local_530) != local_520) {
    operator_delete((long *)CONCAT44(uStack_52c,local_530),local_520[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_) !=
      &local_560.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_),
                    local_560.field_2._M_allocated_capacity + 1);
  }
  uVar8 = (ulong)((int)local_538 + (uint)((int)local_538 == 0));
  iVar3 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"subroutine(colorGetter) ",0x18);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)CONCAT44(local_560._M_dataplus._M_p._4_4_,
                                         local_560._M_dataplus._M_p._0_4_),
                        local_560._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," getter",7);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(in ",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_510._M_dataplus._M_p,local_510._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," in_value",9);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(uStack_52c,local_530),local_528);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n{\n",4);
    if ((long *)CONCAT44(uStack_52c,local_530) != local_520) {
      operator_delete((long *)CONCAT44(uStack_52c,local_530),local_520[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_) !=
        &local_560.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_),
                      local_560.field_2._M_allocated_capacity + 1);
    }
    poVar4 = (ostream *)local_1a8;
    if ((uint)local_538 < 2) {
      if (local_53c == VARIABLE_TYPE_BOOL) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    return ",0xb);
        pbVar7 = ::glcts::fixed_sample_locations_values + 1;
        if (bVar1) {
          iVar3 = std::__cxx11::string::compare((char *)&local_510);
          pbVar7 = (bool *)0x1bf576f;
          if (iVar3 == 0) {
            pbVar7 = (bool *)0x1b44f2b;
          }
        }
        sVar6 = strlen(pbVar7);
        lVar12 = 0xc;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pbVar7,sVar6);
        pcVar10 = "(in_value);\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    return (in_value + ",0x17);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar3 + 1);
        lVar12 = 3;
        pcVar10 = ");\n";
      }
    }
    else {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_510._M_dataplus._M_p,local_510._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," temp",5);
      std::__cxx11::stringbuf::str();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)CONCAT44(local_560._M_dataplus._M_p._4_4_,
                                                  local_560._M_dataplus._M_p._0_4_),
                          local_560._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_) !=
          &local_560.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_),
                        local_560.field_2._M_allocated_capacity + 1);
      }
      if (local_53c == VARIABLE_TYPE_BOOL) {
        uVar11 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    temp[",9);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
          pbVar7 = ::glcts::fixed_sample_locations_values + 1;
          if (bVar1) {
            iVar3 = std::__cxx11::string::compare((char *)&local_510);
            pbVar7 = (bool *)0x1bf576f;
            if (iVar3 == 0) {
              pbVar7 = (bool *)0x1b44f2b;
            }
          }
          sVar6 = strlen(pbVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pbVar7,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(in_value[",10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]);\n",4);
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      else {
        uVar11 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    temp[",9);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = in_value[",0xd);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] + ",4);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3 + 1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      lVar12 = 0x11;
      pcVar10 = "    return temp;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,lVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
    iVar3 = 1;
    bVar2 = false;
  } while (bVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"subroutine uniform colorGetter colorGetterUniform;\n\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
  if (local_53c == VARIABLE_TYPE_BOOL) {
    local_560._M_dataplus._M_p._0_4_ = 9;
    local_530 = Utils::getVariableTypeFromProperties((_variable_type *)&local_560,&local_4ec);
    Utils::getVariableTypeGLSLString_abi_cxx11_(&local_560,(Utils *)&local_530,variable_type_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_),
               local_560._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_) !=
        &local_560.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_),
                      local_560.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_510._M_dataplus._M_p,local_510._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," result;\n\n",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main()\n{\n    ",0x12);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_510._M_dataplus._M_p,local_510._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," temp",5);
  if (1 < (uint)local_538) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
  if ((uint)local_538 != 0) {
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    temp",8);
      if (1 < (uint)local_538) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_510._M_dataplus._M_p,local_510._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
      uVar9 = local_4dc;
      if (local_53c == VARIABLE_TYPE_BOOL) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"true",4);
      }
      else {
        for (; uVar9 != 0; uVar9 = uVar9 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"3",1);
          if (uVar9 != 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_4e8);
  }
  if (local_53c == VARIABLE_TYPE_BOOL) {
    local_560._M_dataplus._M_p._0_4_ = 9;
    local_4cc = Utils::getVariableTypeFromProperties((_variable_type *)&local_560,&local_4ec);
    Utils::getVariableTypeGLSLString_abi_cxx11_(&local_560,(Utils *)&local_4cc,variable_type_02);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)CONCAT44(uStack_52c,local_530),local_528);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," subroutine_result = colorGetterUniform(temp);\nresult = ",0x38);
    if ((long *)CONCAT44(uStack_52c,local_530) != local_520) {
      operator_delete((long *)CONCAT44(uStack_52c,local_530),local_520[0] + 1);
    }
    if ((uint)local_538 != 0) {
      uVar9 = (uint)local_538 - 1;
      uVar8 = 0;
      do {
        iVar3 = std::__cxx11::string::compare((char *)&local_510);
        pcVar10 = "all(subroutine_result";
        if (iVar3 == 0) {
          pcVar10 = "bool(subroutine_result";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar10,(ulong)(iVar3 == 0) + 0x15);
        if (1 < (uint)local_538) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
        if (uVar9 != uVar8) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"&& ",3);
        }
        uVar8 = uVar8 + 1;
      } while (local_4e8 != uVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," == true ? ",0xb);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)CONCAT44(local_560._M_dataplus._M_p._4_4_,
                                         local_560._M_dataplus._M_p._0_4_),
                        local_560._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(1) : ",6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(local_560._M_dataplus._M_p._4_4_,
                                                local_560._M_dataplus._M_p._0_4_),
                        local_560._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(0);",4);
  }
  else {
    if ((uint)local_538 < 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"result = colorGetterUniform(temp);\n",0x23);
      goto LAB_00976081;
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_510._M_dataplus._M_p,local_510._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," subroutine_result",0x12);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(local_560._M_dataplus._M_p._4_4_,
                                                local_560._M_dataplus._M_p._0_4_),
                        local_560._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               " = colorGetterUniform(temp);\n\nif (subroutine_result[0] == subroutine_result[1]) result = subroutine_result[0];\nelse\nresult = "
               ,0x7d);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_510._M_dataplus._M_p,local_510._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(-1);\n",6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_) !=
      &local_560.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_560._M_dataplus._M_p._4_4_,local_560._M_dataplus._M_p._0_4_),
                    local_560.field_2._M_allocated_capacity + 1);
  }
LAB_00976081:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base((ios_base *)(local_4b8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_4d8;
}

Assistant:

std::string FunctionalTest1_2::getVertexShaderBody(const Utils::_variable_type& variable_type, unsigned int array_size)
{
	Utils::_variable_type base_variable_type		 = Utils::getBaseVariableType(variable_type);
	unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
	std::stringstream	 result_sstream;
	std::string			  variable_type_glsl = Utils::getVariableTypeGLSLString(variable_type);
	std::stringstream	 variable_type_glsl_array_sstream;
	std::stringstream	 variable_type_glsl_arrayed_sstream;

	variable_type_glsl_arrayed_sstream << variable_type_glsl;

	if (array_size > 1)
	{
		variable_type_glsl_array_sstream << "[" << array_size << "]";
		variable_type_glsl_arrayed_sstream << variable_type_glsl_array_sstream.str();
	}

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n";

	if (variable_type == Utils::VARIABLE_TYPE_DOUBLE)
	{
		result_sstream << "#extension GL_ARB_gpu_shader_fp64 : require\n";
	}

	/* Form subroutine type declaration */
	result_sstream << "\n"
					  "subroutine "
				   << variable_type_glsl_arrayed_sstream.str() << " colorGetter(in " << variable_type_glsl
				   << " in_value" << variable_type_glsl_array_sstream.str() << ");\n"
																			   "\n";

	/* Declare getter functions */
	for (int n_getter = 0; n_getter < 2; ++n_getter)
	{
		result_sstream << "subroutine(colorGetter) " << variable_type_glsl_arrayed_sstream.str() << " getter"
					   << n_getter << "(in " << variable_type_glsl << " in_value"
					   << variable_type_glsl_array_sstream.str() << ")\n"
																	"{\n";

		if (array_size > 1)
		{
			result_sstream << variable_type_glsl << " temp" << variable_type_glsl_array_sstream.str() << ";\n";
		}

		if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
		{
			if (array_size > 1)
			{
				for (unsigned int array_index = 0; array_index < array_size; ++array_index)
				{
					result_sstream << "    temp[" << array_index << "]"
																	" = "
								   << ((n_getter == 0) ? ((variable_type_glsl == "bool") ? "!" : "not") : "")
								   << "(in_value[" << array_index << "]);\n";
				}

				result_sstream << "    return temp;\n";
			}
			else
			{
				result_sstream << "    return "
							   << ((n_getter == 0) ? ((variable_type_glsl == "bool") ? "!" : "not") : "")
							   << "(in_value);\n";
			}
		} /* if (base_variable_type == Utils::VARIABLE_TYPE_BOOL) */
		else
		{
			if (array_size > 1)
			{
				for (unsigned int array_index = 0; array_index < array_size; ++array_index)
				{
					result_sstream << "    temp[" << array_index << "]"
																	" = in_value["
								   << array_index << "] + " << (n_getter + 1) << ";\n";
				}

				result_sstream << "    return temp;\n";
			}
			else
			{
				result_sstream << "    return (in_value + " << (n_getter + 1) << ");\n";
			}
		}

		result_sstream << "}\n";
	} /* for (both getter functions) */

	/* Declare subroutine uniform */
	result_sstream << "subroutine uniform colorGetter colorGetterUniform;\n"
					  "\n";

	/* Declare output variable */
	result_sstream << "out ";

	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		Utils::_variable_type result_as_int_variable_type =
			Utils::getVariableTypeFromProperties(Utils::VARIABLE_TYPE_INT, n_variable_type_components);
		std::string variable_type_glsl_as_int = Utils::getVariableTypeGLSLString(result_as_int_variable_type);

		result_sstream << variable_type_glsl_as_int;
	}
	else
	{
		result_sstream << variable_type_glsl;
	}

	result_sstream << " result;\n"
					  "\n";

	/* Declare main(): prepare input argument for the subroutine function */
	result_sstream << "void main()\n"
					  "{\n"
					  "    "
				   << variable_type_glsl << " temp";

	if (array_size > 1)
	{
		result_sstream << "[" << array_size << "]";
	};

	result_sstream << ";\n";

	for (unsigned int array_index = 0; array_index < array_size; ++array_index)
	{
		result_sstream << "    temp";

		if (array_size > 1)
		{
			result_sstream << "[" << array_index << "]";
		}

		result_sstream << " = " << variable_type_glsl << "(";

		if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
		{
			result_sstream << "true";
		}
		else
		{
			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << "3";

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			} /* for (all components) */
		}

		result_sstream << ");\n";
	} /* for (all array indices) */

	/* Declare main(): call the subroutine. Verify the input and write the result
	 *                 to the output variable.
	 **/
	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		Utils::_variable_type result_as_int_variable_type =
			Utils::getVariableTypeFromProperties(Utils::VARIABLE_TYPE_INT, n_variable_type_components);
		std::string variable_type_glsl_as_int = Utils::getVariableTypeGLSLString(result_as_int_variable_type);

		result_sstream << variable_type_glsl_arrayed_sstream.str() << " subroutine_result = colorGetterUniform(temp);\n"
																	  "result = ";

		for (unsigned int array_index = 0; array_index < array_size; ++array_index)
		{
			if (variable_type_glsl == "bool")
				result_sstream << "bool(subroutine_result";
			else
				result_sstream << "all(subroutine_result";

			if (array_size > 1)
			{
				result_sstream << "[" << array_index << "]";
			}

			result_sstream << ")";

			if (array_index != (array_size - 1))
			{
				result_sstream << "&& ";
			}
		}

		result_sstream << " == true ? " << variable_type_glsl_as_int << "(1) : " << variable_type_glsl_as_int << "(0);";
	}
	else
	{
		if (array_size > 1)
		{
			DE_ASSERT(array_size == 2);

			result_sstream << variable_type_glsl << " subroutine_result" << variable_type_glsl_array_sstream.str()
						   << " = colorGetterUniform(temp);\n"
							  "\n"
							  "if (subroutine_result[0] == subroutine_result[1]) result = subroutine_result[0];\n"
							  "else\n"
							  "result = "
						   << variable_type_glsl << "(-1);\n";
		}
		else
		{
			result_sstream << "result = colorGetterUniform(temp);\n";
		}
	}

	/* All done */
	result_sstream << "}\n";

	return result_sstream.str();
}